

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-internal.h
# Opt level: O0

string * __thiscall
testing::internal::GetPrefixUntilComma_abi_cxx11_
          (string *__return_storage_ptr__,internal *this,char *str)

{
  char *__beg;
  char *__end;
  allocator<char> local_35 [19];
  byte local_22;
  allocator local_21;
  char *local_20;
  char *comma;
  char *str_local;
  
  comma = (char *)this;
  str_local = (char *)__return_storage_ptr__;
  __end = strchr((char *)this,0x2c);
  __beg = comma;
  local_22 = 0;
  local_20 = __end;
  if (__end == (char *)0x0) {
    std::allocator<char>::allocator();
    local_22 = 1;
    std::__cxx11::string::string((string *)__return_storage_ptr__,__beg,&local_21);
  }
  else {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<char_const*,void>
              ((string *)__return_storage_ptr__,__beg,__end,local_35);
    std::allocator<char>::~allocator(local_35);
  }
  if ((local_22 & 1) != 0) {
    std::allocator<char>::~allocator((allocator<char> *)&local_21);
  }
  return __return_storage_ptr__;
}

Assistant:

inline std::string GetPrefixUntilComma(const char* str) {
  const char* comma = strchr(str, ',');
  return comma == NULL ? str : std::string(str, comma);
}